

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

AST * __thiscall jsonnet::internal::anon_unknown_0::Parser::parse(Parser *this,uint max_precedence)

{
  pointer *ppFVar1;
  _List_node_base *p_Var2;
  Allocator *pAVar3;
  pointer pcVar4;
  bool bVar5;
  __uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_> _Var6;
  int iVar7;
  _Head_base<0UL,_jsonnet::internal::Token_*,_false> this_00;
  LiteralString *pLVar8;
  Identifier *pIVar9;
  pointer pBVar10;
  __uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
  _Var11;
  AST *pAVar12;
  Function *pFVar13;
  StaticError *pSVar14;
  unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_> uVar15;
  Fodder *args_2;
  bool trailing_comma;
  bool is_function;
  __uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
  local_500;
  AST *msg;
  pointer pAStack_4f0;
  pointer local_4e8;
  unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_> begin__1;
  AST *cond;
  AST *local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  Token semicolon;
  AST *rest;
  pointer pAStack_3f0;
  pointer local_3e8;
  uint local_3dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  LiteralString *lit;
  undefined1 local_3c8 [8];
  undefined1 local_3c0 [96];
  undefined1 local_360 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340 [3];
  unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_> begin_;
  undefined1 local_308 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  undefined1 local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  LocationRange local_290 [4];
  Binds binds;
  Fodder fodder_r;
  Identifier *id;
  Fodder colonFodder;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  LocationRange local_a8;
  ArgParams local_68;
  Fodder fodder_l;
  
  this_00._M_head_impl = (Token *)operator_new(0xc0);
  Token::Token(this_00._M_head_impl,
               (Token *)((this->tokens->
                         super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                         )._M_impl._M_node.super__List_node_base._M_next + 1));
  pFVar13 = (Function *)0x0;
  local_500._M_t.
  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
       (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
       (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
       this_00._M_head_impl;
  begin__1._M_t.
  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
  _M_t.
  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
       (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
        )(__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )this_00._M_head_impl;
  switch((this_00._M_head_impl)->kind) {
  case ASSERT:
    Token::Token((Token *)&begin_,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290[0].file._M_dataplus._M_p != &local_290[0].file.field_2) {
      operator_delete(local_290[0].file._M_dataplus._M_p,
                      local_290[0].file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_p != &local_2a0) {
      operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_p != &local_2c0) {
      operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._0_8_ != &local_2e0) {
      operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_308);
    cond = parse(this,0xf);
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    msg = (AST *)0x0;
    p_Var2 = (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if ((*(int *)&p_Var2[1]._M_next == 0xc) &&
       (iVar7 = std::__cxx11::string::compare((char *)(p_Var2 + 3)), iVar7 == 0)) {
      Token::Token(&semicolon,
                   (Token *)((this->tokens->
                             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                             )._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
      _M_erase(this->tokens,
               (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&colonFodder,&semicolon.fodder);
      msg = parse(this,0xf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
        operator_delete(semicolon.location.file._M_dataplus._M_p,
                        semicolon.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
          &semicolon.stringBlockTermIndent.field_2) {
        operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                        semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
        operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                        semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
        operator_delete(semicolon.data._M_dataplus._M_p,
                        semicolon.data.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&semicolon.fodder);
    }
    popExpect(&semicolon,this,SEMICOLON,(char *)0x0);
    pAVar12 = parse(this,0xf);
    _Var6._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_500;
    pAVar3 = this->alloc;
    pcVar4 = (((LocationRange *)
              ((long)local_500._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    rest = pAVar12;
    lit = (LiteralString *)local_3c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&lit,pcVar4,
               pcVar4 + (((LocationRange *)
                         ((long)local_500._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    local_3c0._16_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).line;
    local_3c0._24_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    local_3c0._32_8_ = (pAVar12->location).end.line;
    local_3c0._40_8_ = (pAVar12->location).end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Assert,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                        (pAVar3,(LocationRange *)&lit,
                         (Fodder *)
                         ((long)_Var6._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),&cond,&colonFodder,&msg,&semicolon.fodder,&rest);
    if (lit != (LiteralString *)local_3c0) {
      operator_delete(lit,local_3c0._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&semicolon.fodder);
    args_2 = &colonFodder;
    break;
  default:
    goto switchD_001694ba_caseD_13;
  case ERROR:
    Token::Token((Token *)&begin_,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290[0].file._M_dataplus._M_p != &local_290[0].file.field_2) {
      operator_delete(local_290[0].file._M_dataplus._M_p,
                      local_290[0].file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_p != &local_2a0) {
      operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_p != &local_2c0) {
      operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._0_8_ != &local_2e0) {
      operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_308);
    pLVar8 = (LiteralString *)parse(this,0xf);
    _Var6._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_500;
    pAVar3 = this->alloc;
    ppFVar1 = &semicolon.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pcVar4 = (((LocationRange *)
              ((long)local_500._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    semicolon._0_8_ = ppFVar1;
    lit = pLVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&semicolon,pcVar4,
               pcVar4 + (((LocationRange *)
                         ((long)local_500._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    semicolon.data._M_dataplus._M_p =
         (pointer)(((LocationRange *)
                   ((long)_Var6._M_t.
                          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl +
                   0x80))->begin).line;
    semicolon.data._M_string_length =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    semicolon.data.field_2._M_allocated_capacity = (pLVar8->super_AST).location.end.line;
    semicolon.data.field_2._8_8_ = (pLVar8->super_AST).location.end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Error,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                        (pAVar3,(LocationRange *)&semicolon,
                         (Fodder *)
                         ((long)_Var6._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),(AST **)&lit);
    uVar15._M_t.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )(__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
            )semicolon._0_8_;
    if ((pointer *)semicolon._0_8_ == ppFVar1) goto switchD_001694ba_caseD_13;
    goto LAB_0016a9ce;
  case FUNCTION:
    Token::Token(&semicolon,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&semicolon.fodder);
    Token::Token((Token *)&lit,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((int)lit != 7) {
      std::__cxx11::stringstream::stringstream((stringstream *)&begin_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_308 + 8),"expected ( but got ",0x13);
      internal::operator<<((ostream *)(local_308 + 8),(Token *)&lit);
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar14,(LocationRange *)(local_360 + 0x10),(string *)&colonFodder);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _Var11.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)
         ((long)local_308 + 8);
    msg = (AST *)0x12;
    begin_._M_t.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )(__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
            )_Var11.
             super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
             ._M_t.
             super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
             .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl;
    begin_._M_t.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )std::__cxx11::string::_M_create((ulong *)&begin_,(ulong)&msg);
    local_300._0_8_ = msg;
    *(undefined8 *)
     begin_._M_t.
     super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
     ._M_t.
     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl = 0x6e6f6974636e7566;
    builtin_strncpy((char *)((long)begin_._M_t.
                                   super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                   .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                   _M_head_impl + 8)," paramet",8);
    ((char *)((long)begin_._M_t.
                    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x10))
    [0] = 'e';
    ((char *)((long)begin_._M_t.
                    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x10))
    [1] = 'r';
    local_308 = (undefined1  [8])msg;
    *(char *)((long)&msg->_vptr_AST +
             (long)begin_._M_t.
                   super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                   .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl) = '\0';
    parseParams((ArgParams *)&cond,this,(string *)&begin_,(bool *)&rest,&colonFodder);
    if ((__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)
        begin_._M_t.
        super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
        ._M_t.
        super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
        .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl !=
        _Var11.
        super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
        ._M_t.
        super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
        .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl) {
      operator_delete((void *)begin_._M_t.
                              super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                              .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl
                      ,(ulong)(local_300._0_8_ + 1));
    }
    pAVar12 = parse(this,0xf);
    _Var6._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_500;
    pAVar3 = this->alloc;
    pcVar4 = (((LocationRange *)
              ((long)local_500._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    msg = pAVar12;
    begin_._M_t.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )(__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
            )_Var11.
             super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
             ._M_t.
             super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
             .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&begin_,pcVar4,
               pcVar4 + (((LocationRange *)
                         ((long)local_500._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    local_2f0._0_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).line;
    local_2f0._8_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    local_2e0._M_allocated_capacity = (pAVar12->location).end.line;
    local_2e0._8_8_ = (pAVar12->location).end.column;
    args_2 = (Fodder *)local_3c8;
    pFVar13 = Allocator::
              make<jsonnet::internal::Function,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                        (pAVar3,(LocationRange *)&begin_,
                         (Fodder *)
                         ((long)_Var6._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),args_2,
                         (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                          *)&cond,(bool *)&rest,&colonFodder,&msg);
    if ((__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)
        begin_._M_t.
        super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
        ._M_t.
        super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
        .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl !=
        _Var11.
        super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
        ._M_t.
        super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
        .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl) {
      operator_delete((void *)begin_._M_t.
                              super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                              .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl
                      ,(ulong)(local_300._0_8_ + 1));
    }
    std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
              ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               &cond);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&colonFodder);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._16_8_ != local_340) {
      operator_delete((void *)local_360._16_8_,local_340[0]._M_allocated_capacity + 1);
    }
    if ((pointer)local_3c0._80_8_ != (pointer)local_360) {
      operator_delete((void *)local_3c0._80_8_,(ulong)(local_360._0_8_ + 1));
    }
    if ((undefined1 *)local_3c0._48_8_ != local_3c0 + 0x40) {
      operator_delete((void *)local_3c0._48_8_,local_3c0._64_8_ + 1);
    }
    if ((undefined1 *)local_3c0._16_8_ != local_3c0 + 0x20) {
      operator_delete((void *)local_3c0._16_8_,local_3c0._32_8_ + 1);
    }
    break;
  case IF:
    Token::Token((Token *)&begin_,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290[0].file._M_dataplus._M_p != &local_290[0].file.field_2) {
      operator_delete(local_290[0].file._M_dataplus._M_p,
                      local_290[0].file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_p != &local_2a0) {
      operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_p != &local_2c0) {
      operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._0_8_ != &local_2e0) {
      operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_308);
    cond = parse(this,0xf);
    popExpect(&semicolon,this,THEN,(char *)0x0);
    pAVar12 = parse(this,0xf);
    _Var6._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_500;
    msg = pAVar12;
    if (*(int *)&(this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 0x13) {
      Token::Token((Token *)&lit,
                   (Token *)((this->tokens->
                             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                             )._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
      _M_erase(this->tokens,
               (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next);
      pAVar12 = parse(this,0xf);
      _Var6._M_t.
      super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
      .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
           (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
           (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
           local_500;
      pAVar3 = this->alloc;
      ppFVar1 = &colonFodder.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pcVar4 = (((LocationRange *)
                ((long)local_500._M_t.
                       super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                       .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80
                ))->file)._M_dataplus._M_p;
      rest = pAVar12;
      colonFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppFVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&colonFodder,pcVar4,
                 pcVar4 + (((LocationRange *)
                           ((long)local_500._M_t.
                                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                  _M_head_impl + 0x80))->file)._M_string_length);
      local_f8._M_allocated_capacity = (pAVar12->location).end.line;
      local_f8._8_8_ = (pAVar12->location).end.column;
      pFVar13 = (Function *)
                Allocator::
                make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                          (pAVar3,(LocationRange *)&colonFodder,
                           (Fodder *)
                           ((long)_Var6._M_t.
                                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                  _M_head_impl + 8),&cond,&semicolon.fodder,&msg,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)local_3c8,&rest);
      if (colonFodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppFVar1) {
        operator_delete(colonFodder.
                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&(colonFodder.
                                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->kind +
                               1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._16_8_ != local_340) {
        operator_delete((void *)local_360._16_8_,local_340[0]._M_allocated_capacity + 1);
      }
      if ((pointer)local_3c0._80_8_ != (pointer)local_360) {
        operator_delete((void *)local_3c0._80_8_,(ulong)(local_360._0_8_ + 1));
      }
      if ((undefined1 *)local_3c0._48_8_ != local_3c0 + 0x40) {
        operator_delete((void *)local_3c0._48_8_,local_3c0._64_8_ + 1);
      }
      if ((undefined1 *)local_3c0._16_8_ != local_3c0 + 0x20) {
        operator_delete((void *)local_3c0._16_8_,local_3c0._32_8_ + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_3c8);
    }
    else {
      pAVar3 = this->alloc;
      pcVar4 = (((LocationRange *)
                ((long)local_500._M_t.
                       super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                       .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80
                ))->file)._M_dataplus._M_p;
      lit = (LiteralString *)local_3c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&lit,pcVar4,
                 pcVar4 + (((LocationRange *)
                           ((long)local_500._M_t.
                                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                  _M_head_impl + 0x80))->file)._M_string_length);
      local_3c0._16_8_ =
           (((LocationRange *)
            ((long)_Var6._M_t.
                   super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                   .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
           begin).line;
      local_3c0._24_8_ =
           (((LocationRange *)
            ((long)_Var6._M_t.
                   super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                   .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
           begin).column;
      local_3c0._32_8_ = (pAVar12->location).end.line;
      local_3c0._40_8_ = (pAVar12->location).end.column;
      colonFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      colonFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colonFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      rest = (AST *)0x0;
      pFVar13 = (Function *)
                Allocator::
                make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,decltype(nullptr)>
                          (pAVar3,(LocationRange *)&lit,
                           (Fodder *)
                           ((long)_Var6._M_t.
                                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                  _M_head_impl + 8),&cond,&semicolon.fodder,&msg,&colonFodder,&rest)
      ;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&colonFodder);
      if (lit != (LiteralString *)local_3c0) {
        operator_delete(lit,local_3c0._0_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    args_2 = &semicolon.fodder;
    break;
  case IMPORT:
    Token::Token(&semicolon,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&semicolon.fodder);
    pLVar8 = (LiteralString *)parse(this,0xf);
    _Var6._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_500;
    if ((pLVar8->super_AST).type != AST_LITERAL_STRING) {
      std::__cxx11::stringstream::stringstream((stringstream *)&begin_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_308 + 8),"computed imports are not allowed.",0x21);
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar14,&(pLVar8->super_AST).location,(string *)&lit);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    lit = pLVar8;
    if (pLVar8->tokenKind == BLOCK) {
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      pLVar8 = lit;
      begin_._M_t.
      super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
      ._M_t.
      super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
      .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
           (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
            )((long)local_308 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&begin_,"Cannot use text blocks in import statements.","");
      StaticError::StaticError(pSVar14,&(pLVar8->super_AST).location,(string *)&begin_);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    pAVar3 = this->alloc;
    begin_._M_t.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )((long)local_308 + 8);
    pcVar4 = (((LocationRange *)
              ((long)local_500._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&begin_,pcVar4,
               pcVar4 + (((LocationRange *)
                         ((long)local_500._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    local_2f0._0_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).line;
    local_2f0._8_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    local_2e0._M_allocated_capacity = (pLVar8->super_AST).location.end.line;
    local_2e0._8_8_ = (pLVar8->super_AST).location.end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Import,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralString*&>
                        (pAVar3,(LocationRange *)&begin_,
                         (Fodder *)
                         ((long)_Var6._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),&lit);
    goto LAB_0016a9b2;
  case IMPORTSTR:
    Token::Token(&semicolon,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&semicolon.fodder);
    pLVar8 = (LiteralString *)parse(this,0xf);
    _Var6._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_500;
    if ((pLVar8->super_AST).type != AST_LITERAL_STRING) {
      std::__cxx11::stringstream::stringstream((stringstream *)&begin_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_308 + 8),"computed imports are not allowed.",0x21);
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar14,&(pLVar8->super_AST).location,(string *)&lit);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    lit = pLVar8;
    if (pLVar8->tokenKind == BLOCK) {
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      pLVar8 = lit;
      begin_._M_t.
      super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
      ._M_t.
      super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
      .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
           (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
            )((long)local_308 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&begin_,"Cannot use text blocks in import statements.","");
      StaticError::StaticError(pSVar14,&(pLVar8->super_AST).location,(string *)&begin_);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    pAVar3 = this->alloc;
    begin_._M_t.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )((long)local_308 + 8);
    pcVar4 = (((LocationRange *)
              ((long)local_500._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&begin_,pcVar4,
               pcVar4 + (((LocationRange *)
                         ((long)local_500._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    local_2f0._0_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).line;
    local_2f0._8_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    local_2e0._M_allocated_capacity = (pLVar8->super_AST).location.end.line;
    local_2e0._8_8_ = (pLVar8->super_AST).location.end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Importstr,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralString*&>
                        (pAVar3,(LocationRange *)&begin_,
                         (Fodder *)
                         ((long)_Var6._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),&lit);
    goto LAB_0016a9b2;
  case IMPORTBIN:
    Token::Token(&semicolon,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&semicolon.fodder);
    pLVar8 = (LiteralString *)parse(this,0xf);
    _Var6._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_500;
    if ((pLVar8->super_AST).type != AST_LITERAL_STRING) {
      std::__cxx11::stringstream::stringstream((stringstream *)&begin_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_308 + 8),"computed imports are not allowed.",0x21);
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar14,&(pLVar8->super_AST).location,(string *)&lit);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    lit = pLVar8;
    if (pLVar8->tokenKind == BLOCK) {
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      pLVar8 = lit;
      begin_._M_t.
      super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
      ._M_t.
      super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
      .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
           (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
            )((long)local_308 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&begin_,"Cannot use text blocks in import statements.","");
      StaticError::StaticError(pSVar14,&(pLVar8->super_AST).location,(string *)&begin_);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    pAVar3 = this->alloc;
    begin_._M_t.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )((long)local_308 + 8);
    pcVar4 = (((LocationRange *)
              ((long)local_500._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&begin_,pcVar4,
               pcVar4 + (((LocationRange *)
                         ((long)local_500._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    local_2f0._0_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).line;
    local_2f0._8_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    local_2e0._M_allocated_capacity = (pLVar8->super_AST).location.end.line;
    local_2e0._8_8_ = (pLVar8->super_AST).location.end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Importbin,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralString*&>
                        (pAVar3,(LocationRange *)&begin_,
                         (Fodder *)
                         ((long)_Var6._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),&lit);
LAB_0016a9b2:
    semicolon.fodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_300._0_8_;
    uVar15._M_t.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         begin_._M_t.
         super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
         ._M_t.
         super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
         .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl;
    if (begin_._M_t.
        super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
        ._M_t.
        super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
        .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl !=
        (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
         )((long)local_308 + 8)) {
LAB_0016a9ce:
      operator_delete((void *)uVar15._M_t.
                              super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                              .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl
                      ,(ulong)((long)&((AST *)semicolon.fodder.
                                              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                              ._M_impl.super__Vector_impl_data._M_finish)->_vptr_AST
                              + 1));
    }
    goto switchD_001694ba_caseD_13;
  case LOCAL:
    Token::Token((Token *)&lit,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._16_8_ != local_340) {
      operator_delete((void *)local_360._16_8_,local_340[0]._M_allocated_capacity + 1);
    }
    if ((pointer)local_3c0._80_8_ != (pointer)local_360) {
      operator_delete((void *)local_3c0._80_8_,(ulong)(local_360._0_8_ + 1));
    }
    if ((undefined1 *)local_3c0._48_8_ != local_3c0 + 0x40) {
      operator_delete((void *)local_3c0._48_8_,local_3c0._64_8_ + 1);
    }
    local_3dc = max_precedence;
    if ((undefined1 *)local_3c0._16_8_ != local_3c0 + 0x20) {
      operator_delete((void *)local_3c0._16_8_,local_3c0._32_8_ + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_3c8);
    binds.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    binds.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    binds.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3d8 = &semicolon.location.file.field_2;
    do {
      popExpect((Token *)&begin_,this,IDENTIFIER,(char *)0x0);
      pAVar3 = this->alloc;
      Token::data32_abi_cxx11_((UString *)&semicolon,(Token *)&begin_);
      pIVar9 = Allocator::makeIdentifier(pAVar3,(UString *)&semicolon);
      pBVar10 = binds.
                super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pointer *)semicolon._0_8_ !=
          &semicolon.fodder.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)semicolon._0_8_,
                        (long)semicolon.fodder.
                              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              ._M_impl.super__Vector_impl_data._M_finish * 4 + 4);
        pBVar10 = binds.
                  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      for (; id = pIVar9,
          pBVar10 !=
          binds.
          super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
          ._M_impl.super__Vector_impl_data._M_finish; pBVar10 = pBVar10 + 1) {
        if (pBVar10->var == pIVar9) {
          pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &semicolon,"duplicate local var: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f0);
          StaticError::StaticError(pSVar14,local_290,(string *)&semicolon);
          __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
        }
      }
      is_function = false;
      local_3e8 = (pointer)0x0;
      rest = (AST *)0x0;
      pAStack_3f0 = (pointer)0x0;
      trailing_comma = false;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (*(int *)&(this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 7) {
        Token::Token(&semicolon,
                     (Token *)((this->tokens->
                               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                               )._M_impl._M_node.super__List_node_base._M_next + 1));
        std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
        _M_erase(this->tokens,
                 (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&fodder_l,&semicolon.fodder);
        cond = (AST *)&local_4c8;
        msg = (AST *)0x12;
        cond = (AST *)std::__cxx11::string::_M_create((ulong *)&cond,(ulong)&msg);
        local_4c8._M_allocated_capacity = (size_type)msg;
        cond->_vptr_AST = (_func_int **)0x6e6f6974636e7566;
        (cond->location).file._M_dataplus._M_p = (pointer)0x74656d6172617020;
        *(undefined2 *)&(cond->location).file._M_string_length = 0x7265;
        local_4d0 = msg;
        *(undefined1 *)((long)&msg->_vptr_AST + (long)&cond->_vptr_AST) = 0;
        parseParams(&local_68,this,(string *)&cond,&trailing_comma,&fodder_r);
        local_4e8 = local_3e8;
        pAStack_4f0 = pAStack_3f0;
        msg = rest;
        rest = (AST *)local_68.
                      super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pAStack_3f0 = local_68.
                      super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_3e8 = local_68.
                    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_68.
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )&msg);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cond != &local_4c8) {
          operator_delete(cond,(ulong)(local_4c8._M_allocated_capacity + 1));
        }
        is_function = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)semicolon.location.file._M_dataplus._M_p != local_3d8) {
          operator_delete(semicolon.location.file._M_dataplus._M_p,
                          semicolon.location.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
            &semicolon.stringBlockTermIndent.field_2) {
          operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                          semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2)
        {
          operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                          semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
          operator_delete(semicolon.data._M_dataplus._M_p,
                          semicolon.data.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&semicolon.fodder);
      }
      popExpect(&semicolon,this,OPERATOR,"=");
      cond = parse(this,0xf);
      Token::Token((Token *)&colonFodder,
                   (Token *)((this->tokens->
                             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                             )._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
      _M_erase(this->tokens,
               (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next);
      std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>::
      emplace_back<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                ((vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>
                  *)&binds,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)local_308,&id,&semicolon.fodder,&cond,&is_function,&fodder_l,
                 (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)&rest,&trailing_comma,&fodder_r,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&colonFodder.
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.location.file._M_dataplus._M_p != local_3d8) {
        operator_delete(semicolon.location.file._M_dataplus._M_p,
                        semicolon.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
          &semicolon.stringBlockTermIndent.field_2) {
        operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                        semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
        operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                        semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
        operator_delete(semicolon.data._M_dataplus._M_p,
                        semicolon.data.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&semicolon.fodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&fodder_r);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&fodder_l);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              &rest);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290[0].file._M_dataplus._M_p != &local_290[0].file.field_2) {
        operator_delete(local_290[0].file._M_dataplus._M_p,
                        local_290[0].file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_p != &local_2a0) {
        operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_p != &local_2c0) {
        operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._0_8_ != &local_2e0) {
        operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_308);
      if ((int)colonFodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start == 4) {
        bVar5 = true;
      }
      else {
        if ((int)colonFodder.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_start != 9) {
          std::__cxx11::stringstream::stringstream((stringstream *)&begin_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_308 + 8),"expected , or ; but got ",0x18);
          internal::operator<<((ostream *)(local_308 + 8),(Token *)&colonFodder);
          pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
          std::__cxx11::stringbuf::str();
          StaticError::StaticError(pSVar14,&local_a8,(string *)&semicolon);
          __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
        }
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.file._M_dataplus._M_p != &local_a8.file.field_2) {
        operator_delete(local_a8.file._M_dataplus._M_p,
                        local_a8.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_p != &local_d8) {
        operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&colonFodder.
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    } while (bVar5);
    pAVar12 = parse(this,0xf);
    _Var6._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_500;
    pAVar3 = this->alloc;
    pcVar4 = (((LocationRange *)
              ((long)local_500._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    semicolon._0_8_ = pAVar12;
    begin_._M_t.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )(__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
            )((long)local_308 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&begin_,pcVar4,
               pcVar4 + (((LocationRange *)
                         ((long)local_500._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    max_precedence = local_3dc;
    local_2f0._0_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).line;
    local_2f0._8_8_ =
         (((LocationRange *)
          ((long)_Var6._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    local_2e0._M_allocated_capacity = (pAVar12->location).end.line;
    local_2e0._8_8_ = (pAVar12->location).end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Local,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
                        (pAVar3,(LocationRange *)&begin_,
                         (Fodder *)
                         ((long)_Var6._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),&binds,(AST **)&semicolon);
    if (begin_._M_t.
        super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
        ._M_t.
        super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
        .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl !=
        (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
         )((long)local_308 + 8)) {
      operator_delete((void *)begin_._M_t.
                              super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                              .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl
                      ,(ulong)(local_300._0_8_ + 1));
    }
    std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    ~vector(&binds);
    goto switchD_001694ba_caseD_13;
  }
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(args_2);
switchD_001694ba_caseD_13:
  if ((__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)
      begin__1._M_t.
      super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
      ._M_t.
      super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
      .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)0x0
     ) {
    std::default_delete<jsonnet::internal::Token>::operator()
              ((default_delete<jsonnet::internal::Token> *)&begin__1,
               (Token *)begin__1._M_t.
                        super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                        .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl);
  }
  if (pFVar13 == (Function *)0x0) {
    _Var11.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)
         operator_new(0xc0);
    Token::Token((Token *)_Var11.
                          super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    begin_._M_t.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )(__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
            )_Var11.
             super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
             ._M_t.
             super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
             .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl;
    pAVar12 = parseTerminalBracketsOrUnary(this);
    pFVar13 = (Function *)
              parseInfix(this,pAVar12,
                         (Token *)_Var11.
                                  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                  _M_head_impl,max_precedence);
    if ((__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)
        begin_._M_t.
        super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
        ._M_t.
        super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
        .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)
        0x0) {
      std::default_delete<jsonnet::internal::Token>::operator()
                ((default_delete<jsonnet::internal::Token> *)&begin_,
                 (Token *)begin_._M_t.
                          super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl);
    }
  }
  return &pFVar13->super_AST;
}

Assistant:

AST *parse(unsigned max_precedence)
    {
        AST *ast = maybeParseGreedy();
        // There cannot be an operator after a greedy parse.
        if (ast != nullptr) return ast;

        // If we get here, we could be parsing an infix construct.

        // Allocate this on the heap to control stack growth.
        std::unique_ptr<Token> begin_(new Token(peek()));
        const Token &begin = *begin_;

        AST *lhs = parseTerminalBracketsOrUnary();

        return parseInfix(lhs, begin, max_precedence);
    }